

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O2

void ConvertRGBToY_SSE2(__m128i *R,__m128i *G,__m128i *B,__m128i *Y)

{
  __m128i alVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  __m128i alVar14;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  alVar14 = *R;
  alVar1 = *G;
  auVar6._0_12_ = alVar14._0_12_;
  auVar6._12_2_ = alVar14[0]._6_2_;
  auVar6._14_2_ = alVar1[0]._6_2_;
  auVar12._12_4_ = auVar6._12_4_;
  auVar12._0_10_ = alVar14._0_10_;
  auVar12._10_2_ = alVar1[0]._4_2_;
  auVar5._10_6_ = auVar12._10_6_;
  auVar5._0_8_ = alVar14[0];
  auVar5._8_2_ = alVar14[0]._4_2_;
  auVar4._8_8_ = auVar5._8_8_;
  auVar4._6_2_ = alVar1[0]._2_2_;
  auVar4._4_2_ = alVar14[0]._2_2_;
  auVar4._0_2_ = (undefined2)alVar14[0];
  auVar4._2_2_ = (short)alVar1[0];
  auVar3._2_2_ = (short)alVar1[1];
  auVar3._0_2_ = (short)alVar14[1];
  auVar3._4_2_ = alVar14[1]._2_2_;
  auVar3._6_2_ = alVar1[1]._2_2_;
  auVar3._8_2_ = alVar14[1]._4_2_;
  auVar3._10_2_ = alVar1[1]._4_2_;
  auVar3._12_2_ = alVar14[1]._6_2_;
  auVar3._14_2_ = alVar1[1]._6_2_;
  auVar11._0_12_ = alVar1._0_12_;
  auVar11._12_2_ = alVar1[0]._6_2_;
  auVar11._14_2_ = *(undefined2 *)((long)*B + 6);
  auVar10._12_4_ = auVar11._12_4_;
  auVar10._0_10_ = alVar1._0_10_;
  auVar10._10_2_ = *(undefined2 *)((long)*B + 4);
  auVar9._10_6_ = auVar10._10_6_;
  auVar9._0_8_ = alVar1[0];
  auVar9._8_2_ = alVar1[0]._4_2_;
  auVar8._8_8_ = auVar9._8_8_;
  auVar8._6_2_ = *(undefined2 *)((long)*B + 2);
  auVar8._4_2_ = alVar1[0]._2_2_;
  auVar8._2_2_ = (short)(*B)[0];
  auVar8._0_2_ = (short)alVar1[0];
  auVar2._2_2_ = (short)(*B)[1];
  auVar2._0_2_ = (short)alVar1[1];
  auVar2._4_2_ = alVar1[1]._2_2_;
  auVar2._6_2_ = *(undefined2 *)((long)*B + 10);
  auVar2._8_2_ = alVar1[1]._4_2_;
  auVar2._10_2_ = *(undefined2 *)((long)*B + 0xc);
  auVar2._12_2_ = alVar1[1]._6_2_;
  auVar2._14_2_ = *(undefined2 *)((long)*B + 0xe);
  auVar7 = pmaddwd(auVar4,_DAT_001218e0);
  auVar3 = pmaddwd(auVar3,_DAT_001218e0);
  auVar12 = pmaddwd(auVar8,_DAT_001218f0);
  auVar2 = pmaddwd(auVar2,_DAT_001218f0);
  auVar13._0_4_ = auVar12._0_4_ + auVar7._0_4_ + 0x108000 >> 0x10;
  auVar13._4_4_ = auVar12._4_4_ + auVar7._4_4_ + 0x108000 >> 0x10;
  auVar13._8_4_ = auVar12._8_4_ + auVar7._8_4_ + 0x108000 >> 0x10;
  auVar13._12_4_ = auVar12._12_4_ + auVar7._12_4_ + 0x108000 >> 0x10;
  auVar7._0_4_ = auVar2._0_4_ + auVar3._0_4_ + 0x108000 >> 0x10;
  auVar7._4_4_ = auVar2._4_4_ + auVar3._4_4_ + 0x108000 >> 0x10;
  auVar7._8_4_ = auVar2._8_4_ + auVar3._8_4_ + 0x108000 >> 0x10;
  auVar7._12_4_ = auVar2._12_4_ + auVar3._12_4_ + 0x108000 >> 0x10;
  alVar14 = (__m128i)packssdw(auVar13,auVar7);
  *Y = alVar14;
  return;
}

Assistant:

static WEBP_INLINE void ConvertRGBToY_SSE2(const __m128i* const R,
                                           const __m128i* const G,
                                           const __m128i* const B,
                                           __m128i* const Y) {
  const __m128i kRG_y = MK_CST_16(16839, 33059 - 16384);
  const __m128i kGB_y = MK_CST_16(16384, 6420);
  const __m128i kHALF_Y = _mm_set1_epi32((16 << YUV_FIX) + YUV_HALF);

  const __m128i RG_lo = _mm_unpacklo_epi16(*R, *G);
  const __m128i RG_hi = _mm_unpackhi_epi16(*R, *G);
  const __m128i GB_lo = _mm_unpacklo_epi16(*G, *B);
  const __m128i GB_hi = _mm_unpackhi_epi16(*G, *B);
  TRANSFORM(RG_lo, RG_hi, GB_lo, GB_hi, kRG_y, kGB_y, kHALF_Y, YUV_FIX, *Y);
}